

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_handshake(mbedtls_ssl_context *ssl)

{
  int iVar1;
  
  iVar1 = -0x7100;
  if ((ssl != (mbedtls_ssl_context *)0x0) && (ssl->conf != (mbedtls_ssl_config *)0x0)) {
    do {
      if (ssl->state == 0x10) {
        return 0;
      }
      iVar1 = mbedtls_ssl_handshake_step(ssl);
    } while (iVar1 == 0);
  }
  return iVar1;
}

Assistant:

int mbedtls_ssl_handshake( mbedtls_ssl_context *ssl )
{
    int ret = 0;

    if( ssl == NULL || ssl->conf == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> handshake" ) );

    while( ssl->state != MBEDTLS_SSL_HANDSHAKE_OVER )
    {
        ret = mbedtls_ssl_handshake_step( ssl );

        if( ret != 0 )
            break;
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= handshake" ) );

    return( ret );
}